

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall stringToUnits_bitsBytes_Test::TestBody(stringToUnits_bitsBytes_Test *this)

{
  uint64_t uVar1;
  char *pcVar2;
  AssertHelper AStack_c8;
  precise_unit local_c0;
  AssertionResult gtest_ar;
  precise_unit local_a0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"KiB",(allocator *)&gtest_ar);
  uVar1 = units::getDefaultFlags();
  local_a0 = units::unit_from_string(&local_30,uVar1);
  std::__cxx11::string::~string((string *)&local_30);
  local_c0 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::kibi,
                        (precise_unit *)units::precise::data::byte);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&gtest_ar,"res","precise::kibi * precise::data::byte",&local_a0,&local_c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x2a5,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    if ((long *)local_c0.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_c0.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_50,"Mib",(allocator *)&gtest_ar);
  uVar1 = units::getDefaultFlags();
  local_a0 = units::unit_from_string(&local_50,uVar1);
  std::__cxx11::string::~string((string *)&local_50);
  local_c0 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::mebi,
                        (precise_unit *)units::precise::data::bit);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&gtest_ar,"res","precise::mebi * precise::data::bit",&local_a0,&local_c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x2a8,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    if ((long *)local_c0.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_c0.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_70,"MAB",(allocator *)&gtest_ar);
  uVar1 = units::getDefaultFlags();
  local_a0 = units::unit_from_string(&local_70,uVar1);
  std::__cxx11::string::~string((string *)&local_70);
  local_c0 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::mega,
                        (precise_unit *)units::precise::data::byte);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&gtest_ar,"res","precise::mega * precise::data::byte",&local_a0,&local_c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x2ab,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    if ((long *)local_c0.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_c0.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_90,"MAb",(allocator *)&gtest_ar);
  uVar1 = units::getDefaultFlags();
  local_a0 = units::unit_from_string(&local_90,uVar1);
  std::__cxx11::string::~string((string *)&local_90);
  local_c0 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::mega,
                        (precise_unit *)units::precise::data::bit);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&gtest_ar,"res","precise::mega * precise::data::bit",&local_a0,&local_c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x2ae,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    if ((long *)local_c0.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_c0.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(stringToUnits, bitsBytes)
{
    auto res = unit_from_string("KiB");
    EXPECT_EQ(res, precise::kibi * precise::data::byte);

    res = unit_from_string("Mib");
    EXPECT_EQ(res, precise::mebi * precise::data::bit);

    res = unit_from_string("MAB");
    EXPECT_EQ(res, precise::mega * precise::data::byte);

    res = unit_from_string("MAb");
    EXPECT_EQ(res, precise::mega * precise::data::bit);
}